

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

_Bool ssh2_connection_filter_queue(ssh2_connection_state *s)

{
  undefined4 uVar1;
  ptrlen msg;
  ptrlen msg_00;
  ptrlen sig;
  ptrlen type_00;
  ptrlen type_01;
  ptrlen pl;
  ptrlen pl_00;
  ptrlen pl_01;
  ptrlen pl_02;
  ptrlen pl_03;
  ptrlen pl_04;
  ptrlen pl_05;
  ptrlen pl_06;
  ptrlen pl_07;
  ptrlen pl_08;
  PacketProtocolLayer *pPVar2;
  _Bool _Var3;
  int iVar4;
  PktIn *pktin_00;
  unsigned_long uVar5;
  unsigned_long uVar6;
  PktOut *pPVar7;
  char *pcVar8;
  unsigned_long uVar9;
  size_t sVar10;
  unsigned_long uVar11;
  long lVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  byte bVar15;
  ptrlen pVar16;
  ptrlen pVar17;
  undefined8 auStack_1240 [161];
  uint local_d38;
  Ssh *local_d28;
  void *local_d20;
  cr_handler_fn_t local_d18;
  undefined4 local_d0c;
  LogContext *local_d08;
  int local_cfc;
  unsigned_long local_cf8;
  ulong local_cf0;
  char *local_ce8;
  Ssh *local_ce0;
  char *local_cd8;
  bool local_cc9;
  LogContext *local_cc8;
  Ssh *local_cc0;
  ulong local_cb8;
  outstanding_channel_request *local_cb0;
  outstanding_channel_request *ocr_1;
  uint local_ca0;
  int type_2;
  uint pixheight_1;
  uint pixwidth_1;
  uint height_1;
  uint width_1;
  ptrlen signame_1;
  uint length;
  ptrlen value;
  ptrlen var;
  undefined8 local_748;
  ssh_ttymodes modes;
  BinarySource bs_modes [1];
  ptrlen encoded_modes;
  uint pixheight;
  uint pixwidth;
  uint height;
  uint width;
  ptrlen termtype;
  uint screen_number;
  ptrlen authdata;
  ptrlen authproto;
  _Bool oneshot;
  ptrlen subsys;
  ptrlen command;
  void *local_178;
  void *local_170;
  void *local_168;
  void *local_160;
  void *local_158;
  void *local_150;
  size_t startpos;
  void *pvStack_138;
  int format;
  ptrlen errmsg;
  _Bool core;
  void *pvStack_120;
  int signum;
  ptrlen signame;
  void *pvStack_108;
  int exitcode;
  size_t local_100;
  ssh2_channel *psStack_f0;
  int bufsize;
  void *local_e8;
  char *err;
  anon_union_16_3_83ab3c39_for_u local_d0;
  ptrlen local_c0;
  outstanding_global_request *local_b0;
  outstanding_global_request *tmp;
  undefined1 auStack_a0 [4];
  int type_1;
  size_t local_98;
  PacketProtocolLayer *local_90;
  PacketProtocolLayer *ppl;
  ChanopenResult chanopen_result;
  _Bool expect_halfopen;
  _Bool reply_success;
  _Bool want_reply;
  uint ext_type;
  uint pktsize;
  uint winsize;
  uint remid;
  uint localid;
  outstanding_channel_request *ocr;
  ssh2_channel *c;
  ptrlen data;
  ptrlen type;
  PktOut *pktout;
  PktIn *pktin;
  ssh2_connection_state *s_local;
  
  bVar15 = 0;
  local_90 = &s->ppl;
  do {
    _Var3 = ssh2_common_filter_queue(&s->ppl);
    if (_Var3) {
      return true;
    }
    pktin_00 = (*((s->ppl).in_pq)->after)
                         (&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,false);
    if (pktin_00 == (PktIn *)0x0) {
      return false;
    }
    local_cb8 = (ulong)(pktin_00->type - 0x50);
    switch(local_cb8) {
    case 0:
      _auStack_a0 = BinarySource_get_string(pktin_00->binarysource_);
      data.len = (size_t)_auStack_a0;
      sVar10 = local_98;
      chanopen_result.u.failure.reason_code._3_1_ = BinarySource_get_bool(pktin_00->binarysource_);
      type_00.len = sVar10;
      type_00.ptr = (void *)data.len;
      chanopen_result.u.failure.reason_code._2_1_ =
           ssh2_connection_parse_global_request(s,type_00,pktin_00);
      if ((chanopen_result.u.failure.reason_code._3_1_ & 1) != 0) {
        tmp._4_4_ = 0x52;
        if ((bool)chanopen_result.u.failure.reason_code._2_1_) {
          tmp._4_4_ = 0x51;
        }
        pPVar7 = ssh_bpp_new_pktout((s->ppl).bpp,tmp._4_4_);
        pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar7->qnode);
      }
      (*((s->ppl).in_pq)->after)(&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,true);
      break;
    case 1:
    case 2:
      if (s->globreq_head == (outstanding_global_request *)0x0) {
        local_cc0 = (s->ppl).ssh;
        pcVar8 = ssh2_pkt_type(((s->ppl).bpp)->pls->kctx,((s->ppl).bpp)->pls->actx,pktin_00->type);
        ssh_proto_error(local_cc0,"Received %s with no outstanding global request",pcVar8);
        return true;
      }
      (*s->globreq_head->handler)(s,pktin_00,s->globreq_head->ctx);
      local_b0 = s->globreq_head;
      s->globreq_head = s->globreq_head->next;
      safefree(local_b0);
      if (s->globreq_head == (outstanding_global_request *)0x0) {
        s->globreq_tail = (outstanding_global_request *)0x0;
      }
      (*((s->ppl).in_pq)->after)(&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,true);
      break;
    default:
      return false;
    case 10:
      local_c0 = BinarySource_get_string(pktin_00->binarysource_);
      data.len = (size_t)local_c0.ptr;
      sVar10 = local_c0.len;
      ocr = (outstanding_channel_request *)safemalloc(1,0xc0,0);
      ocr->handler = (cr_handler_fn_t)s;
      ocr[7].handler = (cr_handler_fn_t)0x0;
      uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
      uVar5 = BinarySource_get_uint32(pktin_00->binarysource_);
      uVar6 = BinarySource_get_uint32(pktin_00->binarysource_);
      type_01.len = sVar10;
      type_01.ptr = (void *)data.len;
      ssh2_connection_parse_channel_open
                ((ChanopenResult *)&err,s,type_01,pktin_00,(SshChannel *)&ocr[7].ctx);
      ppl = (PacketProtocolLayer *)err;
      pPVar2 = ppl;
      chanopen_result._0_8_ = local_d0.failure.wire_message;
      chanopen_result.u.failure.wire_message = (char *)local_d0._8_8_;
      ppl._0_4_ = (int)err;
      ppl = pPVar2;
      if ((int)ppl == 2) {
        share_got_pkt_from_server
                  ((ssh_sharing_connstate *)local_d0.failure.wire_message,pktin_00->type,
                   pktin_00->binarysource_[0].data,(int)pktin_00->binarysource_[0].len);
        safefree(ocr);
      }
      else {
        *(int *)&ocr->ctx = (int)uVar9;
        *(undefined1 *)((long)&ocr->next + 4) = 0;
        if ((int)ppl == 0) {
          pPVar7 = ssh_bpp_new_pktout((s->ppl).bpp,0x5c);
          BinarySink_put_uint32(pPVar7->binarysink_,(ulong)*(uint *)&ocr->ctx);
          BinarySink_put_uint32
                    (pPVar7->binarysink_,(ulong)chanopen_result.u.failure.wire_message & 0xffffffff)
          ;
          BinarySink_put_stringz(pPVar7->binarysink_,(char *)chanopen_result._0_8_);
          BinarySink_put_stringz(pPVar7->binarysink_,"en");
          pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar7->qnode);
          local_cc8 = local_90->logctx;
          pcVar8 = dupprintf("Rejected channel open: %s",chanopen_result._0_8_);
          logevent_and_free(local_cc8,pcVar8);
          safefree((void *)chanopen_result._0_8_);
          safefree(ocr);
        }
        else {
          ocr[7].handler = (cr_handler_fn_t)local_d0.failure.wire_message;
          ssh2_channel_init((ssh2_channel *)ocr);
          *(int *)&ocr[4].next = (int)uVar5;
          *(int *)((long)&ocr[4].next + 4) = (int)uVar6;
          if (((s->ppl).bpp)->vt->packet_size_limit < *(uint *)((long)&ocr[4].next + 4)) {
            *(uint32_t *)((long)&ocr[4].next + 4) = ((s->ppl).bpp)->vt->packet_size_limit;
          }
          if (*(int *)(ocr[7].handler + 8) != 0) {
            uVar1 = *(undefined4 *)(ocr[7].handler + 8);
            *(undefined4 *)&ocr[5].ctx = uVar1;
            *(undefined4 *)((long)&ocr[5].handler + 4) = uVar1;
            *(undefined4 *)&ocr[5].handler = uVar1;
          }
          pPVar7 = ssh_bpp_new_pktout((s->ppl).bpp,0x5b);
          BinarySink_put_uint32(pPVar7->binarysink_,(ulong)*(uint *)&ocr->ctx);
          BinarySink_put_uint32(pPVar7->binarysink_,(ulong)*(uint *)((long)&ocr->ctx + 4));
          BinarySink_put_uint32(pPVar7->binarysink_,(long)*(int *)&ocr[5].handler);
          BinarySink_put_uint32(pPVar7->binarysink_,0x4000);
          pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar7->qnode);
        }
        (*((s->ppl).in_pq)->after)(&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,true);
      }
      break;
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
      uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
      winsize = (uint)uVar9;
      ocr = (outstanding_channel_request *)find234(s->channels,&winsize,ssh2_channelfind);
      if (((ssh2_channel *)ocr == (ssh2_channel *)0x0) ||
         (((ssh2_channel *)ocr)->sharectx == (ssh_sharing_connstate *)0x0)) {
        local_cc9 = true;
        if (pktin_00->type != 0x5b) {
          local_cc9 = pktin_00->type == 0x5c;
        }
        chanopen_result.u.failure.reason_code._1_1_ = local_cc9;
        if (((ssh2_channel *)ocr == (ssh2_channel *)0x0) ||
           ((bool)(((ssh2_channel *)ocr)->halfopen & 1U) != local_cc9)) {
          local_ce0 = (s->ppl).ssh;
          local_cd8 = ssh2_pkt_type(((s->ppl).bpp)->pls->kctx,((s->ppl).bpp)->pls->actx,
                                    pktin_00->type);
          if (ocr == (outstanding_channel_request *)0x0) {
            local_ce8 = "nonexistent";
          }
          else {
            local_ce8 = "open";
            if (((ulong)ocr->next & 0x100000000) != 0) {
              local_ce8 = "half-open";
            }
          }
          ssh_proto_error(local_ce0,"Received %s for %s channel %u",local_cd8,local_ce8,
                          (ulong)winsize);
          return true;
        }
        local_cf0 = (ulong)(pktin_00->type - 0x5b);
        switch(local_cf0) {
        case 0:
          if ((((ssh2_channel *)ocr)->halfopen & 1U) == 0) {
            __assert_fail("c->halfopen",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection2.c"
                          ,0x1ec,
                          "_Bool ssh2_connection_filter_queue(struct ssh2_connection_state *)");
          }
          uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
          *(int *)&ocr->ctx = (int)uVar9;
          *(undefined1 *)((long)&ocr->next + 4) = 0;
          uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
          *(int *)&ocr[4].next = (int)uVar9;
          uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
          *(int *)((long)&ocr[4].next + 4) = (int)uVar9;
          if (((s->ppl).bpp)->vt->packet_size_limit < *(uint *)((long)&ocr[4].next + 4)) {
            *(uint32_t *)((long)&ocr[4].next + 4) = ((s->ppl).bpp)->vt->packet_size_limit;
          }
          chan_open_confirmation((Channel *)ocr[7].handler);
          ssh2_channel_check_close((ssh2_channel *)ocr);
          if (((ulong)ocr[1].handler & 0x100000000) != 0) {
            ssh2_channel_try_eof((ssh2_channel *)ocr);
          }
          break;
        case 1:
          if ((((ssh2_channel *)ocr)->halfopen & 1U) == 0) {
            __assert_fail("c->halfopen",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection2.c"
                          ,0x20c,
                          "_Bool ssh2_connection_filter_queue(struct ssh2_connection_state *)");
          }
          pcVar8 = ssh2_channel_open_failure_error_text(pktin_00);
          chan_open_failed((Channel *)ocr[7].handler,pcVar8);
          safefree(pcVar8);
          del234(s->channels,ocr);
          ssh2_channel_free((ssh2_channel *)ocr);
          break;
        case 2:
          if ((((ssh2_channel *)ocr)->closes & 1U) == 0) {
            uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
            *(int *)&ocr[4].next = *(int *)&ocr[4].next + (int)uVar9;
            ssh2_try_send_and_unthrottle((ssh2_channel *)ocr);
          }
          break;
        case 3:
        case 4:
          if (pktin_00->type == 0x5e) {
            local_cf8 = 0;
          }
          else {
            local_cf8 = BinarySource_get_uint32(pktin_00->binarysource_);
          }
          chanopen_result.u._12_4_ = (undefined4)local_cf8;
          pVar16 = BinarySource_get_string(pktin_00->binarysource_);
          psStack_f0 = (ssh2_channel *)pVar16.ptr;
          c = psStack_f0;
          local_e8 = (void *)pVar16.len;
          data.ptr = local_e8;
          if (pktin_00->binarysource_[0].err == BSE_NO_ERROR) {
            *(int *)&ocr[5].handler = *(int *)&ocr[5].handler - (int)pVar16.len;
            *(int *)&ocr[5].ctx = *(int *)&ocr[5].ctx - (int)pVar16.len;
            if ((chanopen_result.u._12_4_ != 0) && (chanopen_result.u._12_4_ != 1)) {
              data.ptr = (void *)0x0;
            }
            sVar10 = chan_send((Channel *)ocr[7].handler,chanopen_result.u._12_4_ == 1,psStack_f0,
                               (size_t)data.ptr);
            iVar4 = (int)sVar10;
            if (ocr[6].next == (outstanding_channel_request *)0x0) {
              if (((*(int *)&ocr[5].ctx < 1) && (*(int *)&ocr[6].ctx == 2)) &&
                 (*(int *)((long)&ocr[5].handler + 4) < 0x40000000)) {
                *(int *)((long)&ocr[5].handler + 4) = *(int *)((long)&ocr[5].handler + 4) + 0x4000;
              }
              if (iVar4 < *(int *)((long)&ocr[5].handler + 4)) {
                ssh2_set_window((ssh2_channel *)ocr,*(int *)((long)&ocr[5].handler + 4) - iVar4);
              }
              if (((*(int *)((long)&ocr[5].handler + 4) < iVar4) ||
                  (((s->ssh_is_simple & 1U) != 0 && (0 < iVar4)))) &&
                 (((ulong)ocr[1].handler & 0x10000000000) == 0)) {
                *(undefined1 *)((long)&ocr[1].handler + 5) = 1;
                ssh_throttle_conn((s->ppl).ssh,1);
              }
            }
          }
          break;
        case 5:
          if ((((ssh2_channel *)ocr)->closes & 4U) == 0) {
            ((ssh2_channel *)ocr)->closes = ((ssh2_channel *)ocr)->closes | 4;
            chan_send_eof(((ssh2_channel *)ocr)->chan);
            ssh2_channel_check_close((ssh2_channel *)ocr);
          }
          break;
        case 6:
          if ((((ssh2_channel *)ocr)->closes & 4U) == 0) {
            ((ssh2_channel *)ocr)->closes = ((ssh2_channel *)ocr)->closes | 4;
            chan_send_eof(((ssh2_channel *)ocr)->chan);
          }
          if (((s->ppl).remote_bugs & 0x800) == 0) {
            while (ocr[5].next != (outstanding_channel_request *)0x0) {
              local_cb0 = ocr[5].next;
              (*local_cb0->handler)((ssh2_channel *)ocr,(PktIn *)0x0,local_cb0->ctx);
              ocr[5].next = local_cb0->next;
              safefree(local_cb0);
            }
          }
          if (((ulong)ocr[1].handler & 1) == 0) {
            bufchain_clear((bufchain *)&ocr[1].ctx);
            bufchain_clear((bufchain *)(ocr + 3));
            sshfwd_write_eof((SshChannel *)&ocr[7].ctx);
            ssh2_channel_check_throttle((ssh2_channel *)ocr);
          }
          if (((ulong)ocr[1].handler & 8) == 0) {
            *(uint *)&ocr[1].handler = *(uint *)&ocr[1].handler | 8;
            ssh2_channel_check_close((ssh2_channel *)ocr);
          }
          break;
        case 7:
          pVar16 = BinarySource_get_string(pktin_00->binarysource_);
          pvStack_108 = pVar16.ptr;
          data.len = (size_t)pvStack_108;
          local_100 = pVar16.len;
          chanopen_result.u.failure.reason_code._3_1_ =
               BinarySource_get_bool(pktin_00->binarysource_);
          chanopen_result.u.failure.reason_code._2_1_ = 0;
          if (((ulong)ocr[1].handler & 2) != 0) {
            chanopen_result.u.failure.reason_code._3_1_ = 0;
          }
          pVar16.len = local_100;
          pVar16.ptr = (void *)data.len;
          _Var3 = ptrlen_eq_string(pVar16,"exit-status");
          if (_Var3) {
            uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
            iVar4 = toint((uint)uVar9);
            chanopen_result.u.failure.reason_code._2_1_ =
                 chan_rcvd_exit_status((Channel *)ocr[7].handler,iVar4);
          }
          else {
            pVar17.len = local_100;
            pVar17.ptr = (void *)data.len;
            _Var3 = ptrlen_eq_string(pVar17,"exit-signal");
            if (_Var3) {
              errmsg.len._3_1_ = false;
              sVar10 = pktin_00->binarysource_[0].pos;
              for (startpos._4_4_ = 0; startpos._4_4_ < 2; startpos._4_4_ = startpos._4_4_ + 1) {
                pktin_00->binarysource_[0].pos = sVar10;
                pktin_00->binarysource_[0].err = BSE_NO_ERROR;
                pVar16 = make_ptrlen((void *)0x0,0);
                local_158 = pVar16.ptr;
                pvStack_120 = local_158;
                local_150 = (void *)pVar16.len;
                signame.ptr = local_150;
                errmsg.len._4_4_ = 0;
                if (startpos._4_4_ == 0) {
                  pVar16 = BinarySource_get_string(pktin_00->binarysource_);
                  local_168 = pVar16.ptr;
                  pvStack_120 = local_168;
                  local_160 = (void *)pVar16.len;
                  signame.ptr = local_160;
                }
                else {
                  uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
                  errmsg.len._4_4_ = toint((uint)uVar9);
                }
                errmsg.len._3_1_ = BinarySource_get_bool(pktin_00->binarysource_);
                pVar16 = BinarySource_get_string(pktin_00->binarysource_);
                local_178 = pVar16.ptr;
                pvStack_138 = local_178;
                local_170 = (void *)pVar16.len;
                errmsg.ptr = local_170;
                BinarySource_get_string(pktin_00->binarysource_);
                if ((pktin_00->binarysource_[0].err == BSE_NO_ERROR) &&
                   (pktin_00->binarysource_[0].len == pktin_00->binarysource_[0].pos)) break;
              }
              local_cfc = startpos._4_4_;
              if (startpos._4_4_ == 0) {
                sig.len = (size_t)signame.ptr;
                sig.ptr = pvStack_120;
                msg.len = (size_t)errmsg.ptr;
                msg.ptr = pvStack_138;
                chanopen_result.u.failure.reason_code._2_1_ =
                     chan_rcvd_exit_signal((Channel *)ocr[7].handler,sig,errmsg.len._3_1_,msg);
              }
              else if (startpos._4_4_ == 1) {
                msg_00.len = (size_t)errmsg.ptr;
                msg_00.ptr = pvStack_138;
                chanopen_result.u.failure.reason_code._2_1_ =
                     chan_rcvd_exit_signal_numeric
                               ((Channel *)ocr[7].handler,errmsg.len._4_4_,errmsg.len._3_1_,msg_00);
              }
              else {
                chanopen_result.u.failure.reason_code._2_1_ = 0;
              }
            }
            else {
              pl.len = local_100;
              pl.ptr = (void *)data.len;
              _Var3 = ptrlen_eq_string(pl,"shell");
              if (_Var3) {
                chanopen_result.u.failure.reason_code._2_1_ =
                     chan_run_shell((Channel *)ocr[7].handler);
              }
              else {
                pl_00.len = local_100;
                pl_00.ptr = (void *)data.len;
                _Var3 = ptrlen_eq_string(pl_00,"exec");
                if (_Var3) {
                  pVar16 = BinarySource_get_string(pktin_00->binarysource_);
                  chanopen_result.u.failure.reason_code._2_1_ =
                       chan_run_command((Channel *)ocr[7].handler,pVar16);
                }
                else {
                  pl_01.len = local_100;
                  pl_01.ptr = (void *)data.len;
                  _Var3 = ptrlen_eq_string(pl_01,"subsystem");
                  if (_Var3) {
                    pVar16 = BinarySource_get_string(pktin_00->binarysource_);
                    chanopen_result.u.failure.reason_code._2_1_ =
                         chan_run_subsystem((Channel *)ocr[7].handler,pVar16);
                  }
                  else {
                    pl_02.len = local_100;
                    pl_02.ptr = (void *)data.len;
                    _Var3 = ptrlen_eq_string(pl_02,"x11-req");
                    if (_Var3) {
                      _Var3 = BinarySource_get_bool(pktin_00->binarysource_);
                      pVar16 = BinarySource_get_string(pktin_00->binarysource_);
                      pVar17 = BinarySource_get_string(pktin_00->binarysource_);
                      uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
                      chanopen_result.u.failure.reason_code._2_1_ =
                           chan_enable_x11_forwarding
                                     ((Channel *)ocr[7].handler,_Var3,pVar16,pVar17,(uint)uVar9);
                    }
                    else {
                      pl_03.len = local_100;
                      pl_03.ptr = (void *)data.len;
                      _Var3 = ptrlen_eq_string(pl_03,"auth-agent-req@openssh.com");
                      if (_Var3) {
                        chanopen_result.u.failure.reason_code._2_1_ =
                             chan_enable_agent_forwarding((Channel *)ocr[7].handler);
                      }
                      else {
                        pl_04.len = local_100;
                        pl_04.ptr = (void *)data.len;
                        _Var3 = ptrlen_eq_string(pl_04,"pty-req");
                        if (_Var3) {
                          pVar16 = BinarySource_get_string(pktin_00->binarysource_);
                          uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
                          uVar5 = BinarySource_get_uint32(pktin_00->binarysource_);
                          uVar6 = BinarySource_get_uint32(pktin_00->binarysource_);
                          uVar11 = BinarySource_get_uint32(pktin_00->binarysource_);
                          pVar17 = BinarySource_get_string(pktin_00->binarysource_);
                          BinarySource_INIT__((BinarySource *)(modes.mode_val + 0x101),pVar17);
                          read_ttymodes_from_packet
                                    ((ssh_ttymodes *)((long)&var.len + 4),
                                     (BinarySource *)(modes.mode_val + 0x101),2);
                          memcpy(&local_748,(void *)((long)&var.len + 4),0x50c);
                          if ((*(int *)(bs_modes[0]._24_8_ + 0x18) == 0) &&
                             (*(long *)(bs_modes[0]._24_8_ + 0x10) ==
                              *(long *)(bs_modes[0]._24_8_ + 8))) {
                            local_d18 = ocr[7].handler;
                            _height = pVar16.ptr;
                            local_d20 = _height;
                            termtype.ptr = (void *)pVar16.len;
                            puVar13 = &local_748;
                            puVar14 = auStack_1240;
                            local_d0c = (int)uVar9;
                            for (lVar12 = 0xa1; lVar12 != 0; lVar12 = lVar12 + -1) {
                              *puVar14 = *puVar13;
                              puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
                              puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
                            }
                            local_d38 = modes.mode_val[0xff];
                            chanopen_result.u.failure.reason_code._2_1_ =
                                 chan_allocate_pty(local_d18,local_d20,termtype.ptr,local_d0c,
                                                   uVar5 & 0xffffffff,uVar6 & 0xffffffff,(int)uVar11
                                                  );
                          }
                          else {
                            local_d08 = local_90->logctx;
                            pcVar8 = dupprintf("Unable to decode terminal mode string");
                            logevent_and_free(local_d08,pcVar8);
                            chanopen_result.u.failure.reason_code._2_1_ = 0;
                          }
                        }
                        else {
                          pl_05.len = local_100;
                          pl_05.ptr = (void *)data.len;
                          _Var3 = ptrlen_eq_string(pl_05,"env");
                          if (_Var3) {
                            pVar16 = BinarySource_get_string(pktin_00->binarysource_);
                            pVar17 = BinarySource_get_string(pktin_00->binarysource_);
                            chanopen_result.u.failure.reason_code._2_1_ =
                                 chan_set_env((Channel *)ocr[7].handler,pVar16,pVar17);
                          }
                          else {
                            pl_06.len = local_100;
                            pl_06.ptr = (void *)data.len;
                            _Var3 = ptrlen_eq_string(pl_06,"break");
                            if (_Var3) {
                              uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
                              signame_1.len._4_4_ = (uint)uVar9;
                              chanopen_result.u.failure.reason_code._2_1_ =
                                   chan_send_break((Channel *)ocr[7].handler,signame_1.len._4_4_);
                            }
                            else {
                              pl_07.len = local_100;
                              pl_07.ptr = (void *)data.len;
                              _Var3 = ptrlen_eq_string(pl_07,"signal");
                              if (_Var3) {
                                _height_1 = BinarySource_get_string(pktin_00->binarysource_);
                                chanopen_result.u.failure.reason_code._2_1_ =
                                     chan_send_signal((Channel *)ocr[7].handler,_height_1);
                              }
                              else {
                                pl_08.len = local_100;
                                pl_08.ptr = (void *)data.len;
                                _Var3 = ptrlen_eq_string(pl_08,"window-change");
                                if (_Var3) {
                                  uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
                                  pixwidth_1 = (uint)uVar9;
                                  uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
                                  pixheight_1 = (uint)uVar9;
                                  uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
                                  type_2 = (int)uVar9;
                                  uVar9 = BinarySource_get_uint32(pktin_00->binarysource_);
                                  local_ca0 = (uint)uVar9;
                                  chanopen_result.u.failure.reason_code._2_1_ =
                                       chan_change_window_size
                                                 ((Channel *)ocr[7].handler,pixwidth_1,pixheight_1,
                                                  type_2,local_ca0);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          if ((chanopen_result.u.failure.reason_code._3_1_ & 1) != 0) {
            ocr_1._4_4_ = 100;
            if ((chanopen_result.u.failure.reason_code._2_1_ & 1) != 0) {
              ocr_1._4_4_ = 99;
            }
            pPVar7 = ssh_bpp_new_pktout((s->ppl).bpp,ocr_1._4_4_);
            BinarySink_put_uint32(pPVar7->binarysink_,(ulong)*(uint *)&ocr->ctx);
            pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar7->qnode);
          }
          break;
        case 8:
        case 9:
          _remid = ((ssh2_channel *)ocr)->chanreq_head;
          if (_remid == (outstanding_channel_request *)0x0) {
            local_d28 = (s->ppl).ssh;
            pcVar8 = ssh2_pkt_type(((s->ppl).bpp)->pls->kctx,((s->ppl).bpp)->pls->actx,
                                   pktin_00->type);
            ssh_proto_error(local_d28,
                            "Received %s for channel %d with no outstanding channel request",pcVar8,
                            (ulong)*(uint *)((long)&ocr->ctx + 4));
            return true;
          }
          (*_remid->handler)((ssh2_channel *)ocr,pktin_00,_remid->ctx);
          ocr[5].next = _remid->next;
          safefree(_remid);
          ssh2_channel_check_close((ssh2_channel *)ocr);
        }
        (*((s->ppl).in_pq)->after)(&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,true);
      }
      else {
        share_got_pkt_from_server
                  (((ssh2_channel *)ocr)->sharectx,pktin_00->type,pktin_00->binarysource_[0].data,
                   (int)pktin_00->binarysource_[0].len);
        (*((s->ppl).in_pq)->after)(&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,true);
      }
    }
  } while( true );
}

Assistant:

static bool ssh2_connection_filter_queue(struct ssh2_connection_state *s)
{
    PktIn *pktin;
    PktOut *pktout;
    ptrlen type, data;
    struct ssh2_channel *c;
    struct outstanding_channel_request *ocr;
    unsigned localid, remid, winsize, pktsize, ext_type;
    bool want_reply, reply_success, expect_halfopen;
    ChanopenResult chanopen_result;
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */

    while (1) {
        if (ssh2_common_filter_queue(&s->ppl))
            return true;
        if ((pktin = pq_peek(s->ppl.in_pq)) == NULL)
            return false;

        switch (pktin->type) {
          case SSH2_MSG_GLOBAL_REQUEST:
            type = get_string(pktin);
            want_reply = get_bool(pktin);

            reply_success = ssh2_connection_parse_global_request(
                s, type, pktin);

            if (want_reply) {
                int type = (reply_success ? SSH2_MSG_REQUEST_SUCCESS :
                            SSH2_MSG_REQUEST_FAILURE);
                pktout = ssh_bpp_new_pktout(s->ppl.bpp, type);
                pq_push(s->ppl.out_pq, pktout);
            }
            pq_pop(s->ppl.in_pq);
            break;

          case SSH2_MSG_REQUEST_SUCCESS:
          case SSH2_MSG_REQUEST_FAILURE:
            if (!s->globreq_head) {
                ssh_proto_error(
                    s->ppl.ssh,
                    "Received %s with no outstanding global request",
                    ssh2_pkt_type(s->ppl.bpp->pls->kctx, s->ppl.bpp->pls->actx,
                                  pktin->type));
                return true;
            }

            s->globreq_head->handler(s, pktin, s->globreq_head->ctx);
            {
                struct outstanding_global_request *tmp = s->globreq_head;
                s->globreq_head = s->globreq_head->next;
                sfree(tmp);
            }
            if (!s->globreq_head)
                s->globreq_tail = NULL;

            pq_pop(s->ppl.in_pq);
            break;

          case SSH2_MSG_CHANNEL_OPEN:
            type = get_string(pktin);
            c = snew(struct ssh2_channel);
            c->connlayer = s;
            c->chan = NULL;

            remid = get_uint32(pktin);
            winsize = get_uint32(pktin);
            pktsize = get_uint32(pktin);

            chanopen_result = ssh2_connection_parse_channel_open(
                s, type, pktin, &c->sc);

            if (chanopen_result.outcome == CHANOPEN_RESULT_DOWNSTREAM) {
                /*
                 * This channel-open request needs to go to a
                 * connection-sharing downstream, so abandon our own
                 * channel-open procedure and just pass the message on
                 * to sharing.c.
                 */
                share_got_pkt_from_server(
                    chanopen_result.u.downstream.share_ctx, pktin->type,
                    BinarySource_UPCAST(pktin)->data,
                    BinarySource_UPCAST(pktin)->len);
                sfree(c);
                break;
            }

            c->remoteid = remid;
            c->halfopen = false;
            if (chanopen_result.outcome == CHANOPEN_RESULT_FAILURE) {
                pktout = ssh_bpp_new_pktout(
                    s->ppl.bpp, SSH2_MSG_CHANNEL_OPEN_FAILURE);
                put_uint32(pktout, c->remoteid);
                put_uint32(pktout, chanopen_result.u.failure.reason_code);
                put_stringz(pktout, chanopen_result.u.failure.wire_message);
                put_stringz(pktout, "en");      /* language tag */
                pq_push(s->ppl.out_pq, pktout);
                ppl_logevent("Rejected channel open: %s",
                             chanopen_result.u.failure.wire_message);
                sfree(chanopen_result.u.failure.wire_message);
                sfree(c);
            } else {
                c->chan = chanopen_result.u.success.channel;
                ssh2_channel_init(c);
                c->remwindow = winsize;
                c->remmaxpkt = pktsize;
                if (c->remmaxpkt > s->ppl.bpp->vt->packet_size_limit)
                    c->remmaxpkt = s->ppl.bpp->vt->packet_size_limit;
                if (c->chan->initial_fixed_window_size) {
                    c->locwindow = c->locmaxwin = c->remlocwin =
                        c->chan->initial_fixed_window_size;
                }
                pktout = ssh_bpp_new_pktout(
                    s->ppl.bpp, SSH2_MSG_CHANNEL_OPEN_CONFIRMATION);
                put_uint32(pktout, c->remoteid);
                put_uint32(pktout, c->localid);
                put_uint32(pktout, c->locwindow);
                put_uint32(pktout, OUR_V2_MAXPKT); /* our max pkt size */
                pq_push(s->ppl.out_pq, pktout);
            }

            pq_pop(s->ppl.in_pq);
            break;

          case SSH2_MSG_CHANNEL_DATA:
          case SSH2_MSG_CHANNEL_EXTENDED_DATA:
          case SSH2_MSG_CHANNEL_WINDOW_ADJUST:
          case SSH2_MSG_CHANNEL_REQUEST:
          case SSH2_MSG_CHANNEL_EOF:
          case SSH2_MSG_CHANNEL_CLOSE:
          case SSH2_MSG_CHANNEL_OPEN_CONFIRMATION:
          case SSH2_MSG_CHANNEL_OPEN_FAILURE:
          case SSH2_MSG_CHANNEL_SUCCESS:
          case SSH2_MSG_CHANNEL_FAILURE:
            /*
             * Common preliminary code for all the messages from the
             * server that cite one of our channel ids: look up that
             * channel id, check it exists, and if it's for a sharing
             * downstream, pass it on.
             */
            localid = get_uint32(pktin);
            c = find234(s->channels, &localid, ssh2_channelfind);

            if (c && c->sharectx) {
                share_got_pkt_from_server(c->sharectx, pktin->type,
                                          BinarySource_UPCAST(pktin)->data,
                                          BinarySource_UPCAST(pktin)->len);
                pq_pop(s->ppl.in_pq);
                break;
            }

            expect_halfopen = (
                pktin->type == SSH2_MSG_CHANNEL_OPEN_CONFIRMATION ||
                pktin->type == SSH2_MSG_CHANNEL_OPEN_FAILURE);

            if (!c || c->halfopen != expect_halfopen) {
                ssh_proto_error(s->ppl.ssh,
                                "Received %s for %s channel %u",
                                ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                              s->ppl.bpp->pls->actx,
                                              pktin->type),
                                (!c ? "nonexistent" :
                                 c->halfopen ? "half-open" : "open"),
                                localid);
                return true;
            }

            switch (pktin->type) {
              case SSH2_MSG_CHANNEL_OPEN_CONFIRMATION:
                assert(c->halfopen);
                c->remoteid = get_uint32(pktin);
                c->halfopen = false;
                c->remwindow = get_uint32(pktin);
                c->remmaxpkt = get_uint32(pktin);
                if (c->remmaxpkt > s->ppl.bpp->vt->packet_size_limit)
                    c->remmaxpkt = s->ppl.bpp->vt->packet_size_limit;

                chan_open_confirmation(c->chan);

                /*
                 * Now that the channel is fully open, it's possible
                 * in principle to immediately close it. Check whether
                 * it wants us to!
                 *
                 * This can occur if a local socket error occurred
                 * between us sending out CHANNEL_OPEN and receiving
                 * OPEN_CONFIRMATION. If that happens, all we can do
                 * is immediately initiate close proceedings now that
                 * we know the server's id to put in the close
                 * message. We'll have handled that in this code by
                 * having already turned c->chan into a zombie, so its
                 * want_close method (which ssh2_channel_check_close
                 * will consult) will already be returning true.
                 */
                ssh2_channel_check_close(c);

                if (c->pending_eof)
                    ssh2_channel_try_eof(c); /* in case we had a pending EOF */
                break;

              case SSH2_MSG_CHANNEL_OPEN_FAILURE: {
                assert(c->halfopen);

                char *err = ssh2_channel_open_failure_error_text(pktin);
                chan_open_failed(c->chan, err);
                sfree(err);

                del234(s->channels, c);
                ssh2_channel_free(c);

                break;
              }

              case SSH2_MSG_CHANNEL_DATA:
              case SSH2_MSG_CHANNEL_EXTENDED_DATA:
                ext_type = (pktin->type == SSH2_MSG_CHANNEL_DATA ? 0 :
                            get_uint32(pktin));
                data = get_string(pktin);
                if (!get_err(pktin)) {
                    int bufsize;
                    c->locwindow -= data.len;
                    c->remlocwin -= data.len;
                    if (ext_type != 0 && ext_type != SSH2_EXTENDED_DATA_STDERR)
                        data.len = 0; /* ignore unknown extended data */
                    bufsize = chan_send(
                        c->chan, ext_type == SSH2_EXTENDED_DATA_STDERR,
                        data.ptr, data.len);

                    /*
                     * The channel may have turned into a connection-
                     * shared one as a result of that chan_send, e.g.
                     * if the data we just provided completed the X11
                     * auth phase and caused a callback to
                     * x11_sharing_handover. If so, do nothing
                     * further.
                     */
                    if (c->sharectx)
                        break;

                    /*
                     * If it looks like the remote end hit the end of
                     * its window, and we didn't want it to do that,
                     * think about using a larger window.
                     */
                    if (c->remlocwin <= 0 &&
                        c->throttle_state == UNTHROTTLED &&
                        c->locmaxwin < 0x40000000)
                        c->locmaxwin += OUR_V2_WINSIZE;

                    /*
                     * If we are not buffering too much data, enlarge
                     * the window again at the remote side. If we are
                     * buffering too much, we may still need to adjust
                     * the window if the server's sent excess data.
                     */
                    if (bufsize < c->locmaxwin)
                        ssh2_set_window(c, c->locmaxwin - bufsize);

                    /*
                     * If we're either buffering way too much data, or
                     * if we're buffering anything at all and we're in
                     * "simple" mode, throttle the whole channel.
                     */
                    if ((bufsize > c->locmaxwin ||
                         (s->ssh_is_simple && bufsize>0)) &&
                        !c->throttling_conn) {
                        c->throttling_conn = true;
                        ssh_throttle_conn(s->ppl.ssh, +1);
                    }
                }
                break;

              case SSH2_MSG_CHANNEL_WINDOW_ADJUST:
                if (!(c->closes & CLOSES_SENT_EOF)) {
                    c->remwindow += get_uint32(pktin);
                    ssh2_try_send_and_unthrottle(c);
                }
                break;

              case SSH2_MSG_CHANNEL_REQUEST:
                type = get_string(pktin);
                want_reply = get_bool(pktin);

                reply_success = false;

                if (c->closes & CLOSES_SENT_CLOSE) {
                    /*
                     * We don't reply to channel requests after we've
                     * sent CHANNEL_CLOSE for the channel, because our
                     * reply might cross in the network with the other
                     * side's CHANNEL_CLOSE and arrive after they have
                     * wound the channel up completely.
                     */
                    want_reply = false;
                }

                /*
                 * Try every channel request name we recognise, no
                 * matter what the channel, and see if the Channel
                 * instance will accept it.
                 */
                if (ptrlen_eq_string(type, "exit-status")) {
                    int exitcode = toint(get_uint32(pktin));
                    reply_success = chan_rcvd_exit_status(c->chan, exitcode);
                } else if (ptrlen_eq_string(type, "exit-signal")) {
                    ptrlen signame;
                    int signum;
                    bool core = false;
                    ptrlen errmsg;
                    int format;

                    /*
                     * ICK: older versions of OpenSSH (e.g. 3.4p1)
                     * provide an `int' for the signal, despite its
                     * having been a `string' in the drafts of RFC
                     * 4254 since at least 2001. (Fixed in session.c
                     * 1.147.) Try to infer which we can safely parse
                     * it as.
                     */

                    size_t startpos = BinarySource_UPCAST(pktin)->pos;

                    for (format = 0; format < 2; format++) {
                        BinarySource_UPCAST(pktin)->pos = startpos;
                        BinarySource_UPCAST(pktin)->err = BSE_NO_ERROR;

                        /* placate compiler warnings about unin */
                        signame = make_ptrlen(NULL, 0);
                        signum = 0;

                        if (format == 0) /* standard string-based format */
                            signame = get_string(pktin);
                        else      /* nonstandard integer format */
                            signum = toint(get_uint32(pktin));

                        core = get_bool(pktin);
                        errmsg = get_string(pktin); /* error message */
                        get_string(pktin);     /* language tag */

                        if (!get_err(pktin) && get_avail(pktin) == 0)
                            break;             /* successful parse */
                    }

                    switch (format) {
                      case 0:
                        reply_success = chan_rcvd_exit_signal(
                            c->chan, signame, core, errmsg);
                        break;
                      case 1:
                        reply_success = chan_rcvd_exit_signal_numeric(
                            c->chan, signum, core, errmsg);
                        break;
                      default:
                        /* Couldn't parse this message in either format */
                        reply_success = false;
                        break;
                    }
                } else if (ptrlen_eq_string(type, "shell")) {
                    reply_success = chan_run_shell(c->chan);
                } else if (ptrlen_eq_string(type, "exec")) {
                    ptrlen command = get_string(pktin);
                    reply_success = chan_run_command(c->chan, command);
                } else if (ptrlen_eq_string(type, "subsystem")) {
                    ptrlen subsys = get_string(pktin);
                    reply_success = chan_run_subsystem(c->chan, subsys);
                } else if (ptrlen_eq_string(type, "x11-req")) {
                    bool oneshot = get_bool(pktin);
                    ptrlen authproto = get_string(pktin);
                    ptrlen authdata = get_string(pktin);
                    unsigned screen_number = get_uint32(pktin);
                    reply_success = chan_enable_x11_forwarding(
                        c->chan, oneshot, authproto, authdata, screen_number);
                } else if (ptrlen_eq_string(type,
                                            "auth-agent-req@openssh.com")) {
                    reply_success = chan_enable_agent_forwarding(c->chan);
                } else if (ptrlen_eq_string(type, "pty-req")) {
                    ptrlen termtype = get_string(pktin);
                    unsigned width = get_uint32(pktin);
                    unsigned height = get_uint32(pktin);
                    unsigned pixwidth = get_uint32(pktin);
                    unsigned pixheight = get_uint32(pktin);
                    ptrlen encoded_modes = get_string(pktin);
                    BinarySource bs_modes[1];
                    struct ssh_ttymodes modes;

                    BinarySource_BARE_INIT_PL(bs_modes, encoded_modes);
                    modes = read_ttymodes_from_packet(bs_modes, 2);
                    if (get_err(bs_modes) || get_avail(bs_modes) > 0) {
                        ppl_logevent("Unable to decode terminal mode string");
                        reply_success = false;
                    } else {
                        reply_success = chan_allocate_pty(
                            c->chan, termtype, width, height,
                            pixwidth, pixheight, modes);
                    }
                } else if (ptrlen_eq_string(type, "env")) {
                    ptrlen var = get_string(pktin);
                    ptrlen value = get_string(pktin);

                    reply_success = chan_set_env(c->chan, var, value);
                } else if (ptrlen_eq_string(type, "break")) {
                    unsigned length = get_uint32(pktin);

                    reply_success = chan_send_break(c->chan, length);
                } else if (ptrlen_eq_string(type, "signal")) {
                    ptrlen signame = get_string(pktin);

                    reply_success = chan_send_signal(c->chan, signame);
                } else if (ptrlen_eq_string(type, "window-change")) {
                    unsigned width = get_uint32(pktin);
                    unsigned height = get_uint32(pktin);
                    unsigned pixwidth = get_uint32(pktin);
                    unsigned pixheight = get_uint32(pktin);
                    reply_success = chan_change_window_size(
                        c->chan, width, height, pixwidth, pixheight);
                }
                if (want_reply) {
                    int type = (reply_success ? SSH2_MSG_CHANNEL_SUCCESS :
                                SSH2_MSG_CHANNEL_FAILURE);
                    pktout = ssh_bpp_new_pktout(s->ppl.bpp, type);
                    put_uint32(pktout, c->remoteid);
                    pq_push(s->ppl.out_pq, pktout);
                }
                break;

              case SSH2_MSG_CHANNEL_SUCCESS:
              case SSH2_MSG_CHANNEL_FAILURE:
                ocr = c->chanreq_head;
                if (!ocr) {
                    ssh_proto_error(
                        s->ppl.ssh,
                        "Received %s for channel %d with no outstanding "
                        "channel request",
                        ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                      s->ppl.bpp->pls->actx, pktin->type),
                        c->localid);
                    return true;
                }
                ocr->handler(c, pktin, ocr->ctx);
                c->chanreq_head = ocr->next;
                sfree(ocr);
                /*
                 * We may now initiate channel-closing procedures, if
                 * that CHANNEL_REQUEST was the last thing outstanding
                 * before we send CHANNEL_CLOSE.
                 */
                ssh2_channel_check_close(c);
                break;

              case SSH2_MSG_CHANNEL_EOF:
                if (!(c->closes & CLOSES_RCVD_EOF)) {
                    c->closes |= CLOSES_RCVD_EOF;
                    chan_send_eof(c->chan);
                    ssh2_channel_check_close(c);
                }
                break;

              case SSH2_MSG_CHANNEL_CLOSE:
                /*
                 * When we receive CLOSE on a channel, we assume it
                 * comes with an implied EOF if we haven't seen EOF
                 * yet.
                 */
                if (!(c->closes & CLOSES_RCVD_EOF)) {
                    c->closes |= CLOSES_RCVD_EOF;
                    chan_send_eof(c->chan);
                }

                if (!(s->ppl.remote_bugs & BUG_SENDS_LATE_REQUEST_REPLY)) {
                    /*
                     * It also means we stop expecting to see replies
                     * to any outstanding channel requests, so clean
                     * those up too. (ssh_chanreq_init will enforce by
                     * assertion that we don't subsequently put
                     * anything back on this list.)
                     */
                    while (c->chanreq_head) {
                        struct outstanding_channel_request *ocr =
                            c->chanreq_head;
                        ocr->handler(c, NULL, ocr->ctx);
                        c->chanreq_head = ocr->next;
                        sfree(ocr);
                    }
                }

                /*
                 * And we also send an outgoing EOF, if we haven't
                 * already, on the assumption that CLOSE is a pretty
                 * forceful announcement that the remote side is doing
                 * away with the entire channel. (If it had wanted to
                 * send us EOF and continue receiving data from us, it
                 * would have just sent CHANNEL_EOF.)
                 */
                if (!(c->closes & CLOSES_SENT_EOF)) {
                    /*
                     * Abandon any buffered data we still wanted to
                     * send to this channel. Receiving a CHANNEL_CLOSE
                     * is an indication that the server really wants
                     * to get on and _destroy_ this channel, and it
                     * isn't going to send us any further
                     * WINDOW_ADJUSTs to permit us to send pending
                     * stuff.
                     */
                    bufchain_clear(&c->outbuffer);
                    bufchain_clear(&c->errbuffer);

                    /*
                     * Send outgoing EOF.
                     */
                    sshfwd_write_eof(&c->sc);

                    /*
                     * Make sure we don't read any more from whatever
                     * our local data source is for this channel.
                     * (This will pick up on the changes made by
                     * sshfwd_write_eof.)
                     */
                    ssh2_channel_check_throttle(c);
                }

                /*
                 * Now process the actual close.
                 */
                if (!(c->closes & CLOSES_RCVD_CLOSE)) {
                    c->closes |= CLOSES_RCVD_CLOSE;
                    ssh2_channel_check_close(c);
                }

                break;
            }

            pq_pop(s->ppl.in_pq);
            break;

          default:
            return false;
        }
    }
}